

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall kj::anon_unknown_31::HttpOutputStream::flush(HttpOutputStream *this)

{
  undefined8 *puVar1;
  long *plVar2;
  PromiseNode *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar5;
  Own<kj::_::PromiseNode> OVar6;
  ForkedPromise<void> fork;
  undefined1 local_38 [8];
  long *plStack_30;
  Promise<void> local_28;
  
  Promise<void>::fork(&local_28);
  PVar5 = _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_38);
  puVar1 = *(undefined8 **)(in_RSI + 8);
  plVar2 = *(long **)(in_RSI + 0x10);
  *(undefined4 *)(in_RSI + 8) = local_38._0_4_;
  *(undefined4 *)(in_RSI + 0xc) = local_38._4_4_;
  *(uint *)(in_RSI + 0x10) = (uint)plStack_30;
  *(undefined4 *)(in_RSI + 0x14) = plStack_30._4_4_;
  plStack_30 = (long *)0x0;
  if (plVar2 != (long *)0x0) {
    (**(code **)*puVar1)
              (puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10),PVar5.super_PromiseBase.node.ptr);
    plVar2 = plStack_30;
    if (plStack_30 != (long *)0x0) {
      plStack_30 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_38._4_4_,local_38._0_4_))
                ((undefined8 *)CONCAT44(local_38._4_4_,local_38._0_4_),
                 (long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
  }
  OVar6 = (Own<kj::_::PromiseNode>)_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  pPVar3 = local_28.super_PromiseBase.node.ptr;
  if ((EventLoop *)local_28.super_PromiseBase.node.ptr != (EventLoop *)0x0) {
    local_28.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    iVar4 = (**(local_28.super_PromiseBase.node.disposer)->_vptr_Disposer)
                      (local_28.super_PromiseBase.node.disposer,
                       (long)&pPVar3->_vptr_PromiseNode +
                       (long)((EventPort *)pPVar3->_vptr_PromiseNode)[-2]._vptr_EventPort);
    OVar6.disposer._4_4_ = extraout_var;
    OVar6.disposer._0_4_ = iVar4;
    OVar6.ptr = extraout_RDX;
  }
  return (PromiseBase)(PromiseBase)OVar6;
}

Assistant:

kj::Promise<void> flush() {
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();
    return fork.addBranch();
  }